

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_type_traits.hpp
# Opt level: O3

bool jsoncons::
     json_type_traits<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::valarray<unsigned_long>,_void>
     ::is(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *j)

{
  type_conflict9 tVar1;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar2;
  iterator other;
  uint uVar3;
  const_array_range_type cVar4;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> e;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> local_30;
  
  pbVar2 = j;
  while (uVar3 = *(byte *)&pbVar2->field_0 & 0xf, uVar3 - 8 < 2) {
    pbVar2 = *(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)
              ((long)&pbVar2->field_0 + 8);
  }
  if (uVar3 == 0xe) {
    cVar4 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range(j);
    other = cVar4.first_._M_current;
    if (other._M_current == cVar4.last_._M_current._M_current) {
      tVar1 = true;
    }
    else {
      do {
        basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
                  (&local_30,other._M_current);
        tVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                is_integer<unsigned_long>(&local_30);
        basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy(&local_30);
        other._M_current = other._M_current + 1;
      } while (tVar1 && other._M_current != cVar4.last_._M_current._M_current);
    }
  }
  else {
    tVar1 = false;
  }
  return tVar1;
}

Assistant:

static bool is(const Json& j) noexcept
        {
            bool result = j.is_array();
            if (result)
            {
                for (auto e : j.array_range())
                {
                    if (!e.template is<T>())
                    {
                        result = false;
                        break;
                    }
                }
            }
            return result;
        }